

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O3

void __thiscall jwt::decoded_jwt::decoded_jwt(decoded_jwt *this,string *token)

{
  string *psVar1;
  pointer pcVar2;
  string *base;
  string *base_00;
  long lVar3;
  string *psVar4;
  invalid_argument *piVar5;
  anon_class_1_0_00000001 parse_claims;
  undefined1 local_e1;
  undefined1 local_e0 [56];
  string *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  (this->super_header).header_claims._M_h._M_buckets =
       &(this->super_header).header_claims._M_h._M_single_bucket;
  (this->super_header).header_claims._M_h._M_bucket_count = 1;
  (this->super_header).header_claims._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_header).header_claims._M_h._M_element_count = 0;
  (this->super_header).header_claims._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_header).header_claims._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_header).header_claims._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_68 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)&this->super_payload;
  (this->super_payload).payload_claims._M_h._M_buckets =
       &(this->super_payload).payload_claims._M_h._M_single_bucket;
  (this->super_payload).payload_claims._M_h._M_bucket_count = 1;
  (this->super_payload).payload_claims._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_payload).payload_claims._M_h._M_element_count = 0;
  (this->super_payload).payload_claims._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_payload).payload_claims._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_payload).payload_claims._M_h._M_single_bucket = (__node_base_ptr)0x0;
  psVar1 = &this->token;
  local_70 = &(this->token).field_2;
  (this->token)._M_dataplus._M_p = (pointer)local_70;
  pcVar2 = (token->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar2,pcVar2 + token->_M_string_length);
  local_a8 = &this->header;
  local_78 = &(this->header).field_2;
  (this->header)._M_dataplus._M_p = (pointer)local_78;
  (this->header)._M_string_length = 0;
  (this->header).field_2._M_local_buf[0] = '\0';
  local_40 = (string *)&this->header_base64;
  local_80 = &(this->header_base64).field_2;
  (this->header_base64)._M_dataplus._M_p = (pointer)local_80;
  (this->header_base64)._M_string_length = 0;
  (this->header_base64).field_2._M_local_buf[0] = '\0';
  local_48 = &this->payload;
  local_88 = &(this->payload).field_2;
  (this->payload)._M_dataplus._M_p = (pointer)local_88;
  (this->payload)._M_string_length = 0;
  (this->payload).field_2._M_local_buf[0] = '\0';
  local_50 = (string *)&this->payload_base64;
  local_90 = &(this->payload_base64).field_2;
  (this->payload_base64)._M_dataplus._M_p = (pointer)local_90;
  (this->payload_base64)._M_string_length = 0;
  (this->payload_base64).field_2._M_local_buf[0] = '\0';
  local_58 = &this->signature;
  local_98 = &(this->signature).field_2;
  (this->signature)._M_dataplus._M_p = (pointer)local_98;
  (this->signature)._M_string_length = 0;
  (this->signature).field_2._M_local_buf[0] = '\0';
  local_60 = (string *)&this->signature_base64;
  local_a0 = &(this->signature_base64).field_2;
  (this->signature_base64)._M_dataplus._M_p = (pointer)local_a0;
  (this->signature_base64)._M_string_length = 0;
  (this->signature_base64).field_2._M_local_buf[0] = '\0';
  lVar3 = std::__cxx11::string::find((char)token,0x2e);
  local_38 = psVar1;
  if (lVar3 == -1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"invalid token supplied");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar3 = std::__cxx11::string::find((char)token,0x2e);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)local_e0,(ulong)token);
    std::__cxx11::string::operator=(local_40,(string *)local_e0);
    std::__cxx11::string::_M_assign((string *)local_a8);
    pcVar2 = local_e0 + 0x10;
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    std::__cxx11::string::substr((ulong)local_e0,(ulong)token);
    std::__cxx11::string::operator=(local_50,(string *)local_e0);
    psVar1 = local_48;
    std::__cxx11::string::_M_assign((string *)local_48);
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    std::__cxx11::string::substr((ulong)local_e0,(ulong)token);
    std::__cxx11::string::operator=(local_60,(string *)local_e0);
    base_00 = local_58;
    base = local_a8;
    std::__cxx11::string::_M_assign((string *)local_58);
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    psVar4 = alphabet::base64url::fill_abi_cxx11_();
    jwt::base::pad((string *)local_e0,base,psVar4);
    std::__cxx11::string::operator=((string *)base,(string *)local_e0);
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    psVar4 = alphabet::base64url::fill_abi_cxx11_();
    jwt::base::pad((string *)local_e0,psVar1,psVar4);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_e0);
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    psVar4 = alphabet::base64url::fill_abi_cxx11_();
    jwt::base::pad((string *)local_e0,base_00,psVar4);
    std::__cxx11::string::operator=((string *)base_00,(string *)local_e0);
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    psVar4 = alphabet::base64url::fill_abi_cxx11_();
    jwt::base::decode((string *)local_e0,base,(array<char,_64UL> *)alphabet::base64url::data()::data
                      ,psVar4);
    std::__cxx11::string::operator=((string *)base,(string *)local_e0);
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    psVar4 = alphabet::base64url::fill_abi_cxx11_();
    jwt::base::decode((string *)local_e0,psVar1,
                      (array<char,_64UL> *)alphabet::base64url::data()::data,psVar4);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_e0);
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    psVar4 = alphabet::base64url::fill_abi_cxx11_();
    jwt::base::decode((string *)local_e0,base_00,
                      (array<char,_64UL> *)alphabet::base64url::data()::data,psVar4);
    std::__cxx11::string::operator=((string *)base_00,(string *)local_e0);
    if ((pointer)local_e0._0_8_ != pcVar2) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    decoded_jwt(std::__cxx11::string_const&)::{lambda(std::__cxx11::string_const&)#1}::operator()::
    string_const___const
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
                *)local_e0,&local_e1,base);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,local_e0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_e0);
    decoded_jwt(std::__cxx11::string_const&)::{lambda(std::__cxx11::string_const&)#1}::operator()::
    string_const___const
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
                *)local_e0,&local_e1,psVar1);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(local_68,local_e0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_e0);
    return;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"invalid token supplied");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

explicit decoded_jwt(const std::string& token)
			: token(token)
		{
			auto hdr_end = token.find('.');
			if (hdr_end == std::string::npos)
				throw std::invalid_argument("invalid token supplied");
			auto payload_end = token.find('.', hdr_end + 1);
			if (payload_end == std::string::npos)
				throw std::invalid_argument("invalid token supplied");
			header = header_base64 = token.substr(0, hdr_end);
			payload = payload_base64 = token.substr(hdr_end + 1, payload_end - hdr_end - 1);
			signature = signature_base64 = token.substr(payload_end + 1);

			// Fix padding: JWT requires padding to get removed
			header = base::pad<alphabet::base64url>(header);
			payload = base::pad<alphabet::base64url>(payload);
			signature = base::pad<alphabet::base64url>(signature);

			header = base::decode<alphabet::base64url>(header);
			payload = base::decode<alphabet::base64url>(payload);
			signature = base::decode<alphabet::base64url>(signature);

			auto parse_claims = [](const std::string& str) {
				std::unordered_map<std::string, claim> res;
				picojson::value val;
				if (!picojson::parse(val, str).empty())
					throw std::runtime_error("Invalid json");

				for (auto& e : val.get<picojson::object>()) { res.insert({ e.first, claim(e.second) }); }

				return res;
			};

			header_claims = parse_claims(header);
			payload_claims = parse_claims(payload);
		}